

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

void duckdb::Time::Convert(dtime_t dtime,int32_t *hour,int32_t *min,int32_t *sec,int32_t *micros)

{
  undefined1 auVar1 [16];
  int iVar2;
  int64_t time;
  long lVar3;
  
  iVar2 = (int)(dtime.micros / 3600000000);
  lVar3 = (long)iVar2 * -3600000000 + dtime.micros;
  *hour = iVar2;
  iVar2 = (int)(lVar3 / 60000000);
  *min = iVar2;
  lVar3 = (long)iVar2 * -60000000 + lVar3;
  auVar1 = SEXT816(lVar3) * SEXT816(0x431bde82d7b634db);
  iVar2 = (int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f);
  *sec = iVar2;
  *micros = (int)lVar3 + iVar2 * -1000000;
  return;
}

Assistant:

void Time::Convert(dtime_t dtime, int32_t &hour, int32_t &min, int32_t &sec, int32_t &micros) {
	int64_t time = dtime.micros;
	hour = int32_t(time / Interval::MICROS_PER_HOUR);
	time -= int64_t(hour) * Interval::MICROS_PER_HOUR;
	min = int32_t(time / Interval::MICROS_PER_MINUTE);
	time -= int64_t(min) * Interval::MICROS_PER_MINUTE;
	sec = int32_t(time / Interval::MICROS_PER_SEC);
	time -= int64_t(sec) * Interval::MICROS_PER_SEC;
	micros = int32_t(time);
	D_ASSERT(Time::IsValidTime(hour, min, sec, micros));
}